

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

Position __thiscall AI::turn(AI *this,Position *other)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  vector<Position,_std::allocator<Position>_> available;
  Position local_50;
  _Vector_base<Position,_std::allocator<Position>_> local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (lVar5 = 0; lVar5 != 0xf; lVar5 = lVar5 + 1) {
    for (lVar4 = 0; lVar4 != 0xf; lVar4 = lVar4 + 1) {
      if (*(int *)(*(long *)&(this->board->
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[lVar5].
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data + lVar4 * 4) == 0) {
        local_50.x = (int)lVar5;
        local_50.y = (int)lVar4;
        std::vector<Position,_std::allocator<Position>_>::emplace_back<Position>
                  ((vector<Position,_std::allocator<Position>_> *)&local_48,&local_50);
      }
    }
  }
  if (local_48._M_impl.super__Vector_impl_data._M_start ==
      local_48._M_impl.super__Vector_impl_data._M_finish) {
    uVar3 = 0;
    uVar2 = 0;
  }
  else {
    iVar1 = rand();
    uVar2 = (ulong)(long)iVar1 %
            (ulong)((long)local_48._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_48._M_impl.super__Vector_impl_data._M_start >> 3);
    uVar3 = (ulong)(uint)local_48._M_impl.super__Vector_impl_data._M_start[uVar2].x;
    uVar2 = (ulong)(uint)local_48._M_impl.super__Vector_impl_data._M_start[uVar2].y << 0x20;
  }
  std::_Vector_base<Position,_std::allocator<Position>_>::~_Vector_base(&local_48);
  return (Position)(uVar3 | uVar2);
}

Assistant:

Position AI::turn(const Position &other) {
    /*
     * TODO: Write your own ai here!
     * Here is a simple AI which just put chess at empty position!
     * 代做：在这里写下你的AI。
     * 这里有一个示例AI，它只会寻找第一个可下的位置进行落子。
     */
    int i, j;
    vector<Position> available;

    for (i = 0; i < BOARD_SIZE; i++) {
        for (j = 0; j < BOARD_SIZE; j++) {
            if (EMPTY == board[i][j]) {
                available.push_back(Position{i, j});
            }
        }
    }

    if (!available.empty()) {
        return available[rand() % available.size()];
    }

    return {0, 0};
}